

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int get_opaque_attr(attr_list l,atom_t attr_id,int *length_p,char **valp)

{
  int iVar1;
  int iVar2;
  attr_value_type t;
  attr_union v;
  
  iVar1 = query_pattr(l,attr_id,&t,&v);
  iVar2 = 0;
  if ((iVar1 != 0) && (t == Attr_Opaque)) {
    *length_p = (int)v.u.f;
    *valp = (char *)v.u.o.buffer;
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
get_opaque_attr(attr_list l, atom_t attr_id, int *length_p, char **valp)
{
    attr_value_type t;
    attr_union v;
    int ret = query_pattr(l, attr_id, &t, &v);
    if (ret == 0) return 0;
    switch(t) {
    case Attr_Opaque:
        *length_p = v.u.o.length;
	*valp = v.u.o.buffer;
	break;
    default:
	return 0;
    }
    return 1;
}